

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

void __thiscall
Context<true>::PushNamespace(Context<true> *this,char *ns,BaseState<true> *return_state)

{
  pointer *ppNVar1;
  vw *pvVar2;
  iterator __position;
  size_t sVar3;
  substring sVar4;
  Namespace<true> n;
  Namespace<true> local_80;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_80.feature_group = *ns;
  pvVar2 = this->all;
  local_50 = local_40;
  sVar3 = strlen(ns);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,ns,ns + sVar3);
  sVar4.end = local_50 + local_48;
  sVar4.begin = local_50;
  local_80.namespace_hash = (*pvVar2->p->hasher)(sVar4,(ulong)pvVar2->hash_seed);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_80.ftrs = (this->ex->super_example_predict).feature_space + *ns;
  local_80.feature_count = 0;
  __position._M_current =
       (this->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->namespace_path).super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_80.return_state = return_state;
    local_80.name = ns;
    std::vector<Namespace<true>,std::allocator<Namespace<true>>>::
    _M_realloc_insert<Namespace<true>const&>
              ((vector<Namespace<true>,std::allocator<Namespace<true>>> *)&this->namespace_path,
               __position,&local_80);
  }
  else {
    (__position._M_current)->return_state = return_state;
    (__position._M_current)->name = ns;
    (__position._M_current)->ftrs = local_80.ftrs;
    (__position._M_current)->feature_count = 0;
    *(ulong *)__position._M_current = CONCAT71(local_80._1_7_,local_80.feature_group);
    (__position._M_current)->namespace_hash = local_80.namespace_hash;
    ppNVar1 = &(this->namespace_path).
               super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  return;
}

Assistant:

void PushNamespace(const char* ns, BaseState<audit>* return_state)
  {
    Namespace<audit> n;
    n.feature_group = ns[0];
    n.namespace_hash = VW::hash_space(*all, ns);
    n.ftrs = ex->feature_space + ns[0];
    n.feature_count = 0;
    n.return_state = return_state;

    n.name = ns;

    namespace_path.push_back(n);
  }